

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

void __thiscall
gl4cts::GPUShaderFP64Test10::prepareArgument
          (GPUShaderFP64Test10 *this,functionObject *function_object,GLuint vertex,GLubyte *buffer)

{
  GLuint GVar1;
  GLuint GVar2;
  uint uVar3;
  GPUShaderFP64Test10 *this_00;
  ulong uVar4;
  GLuint argument;
  GLuint argument_00;
  
  this_00 = (GPUShaderFP64Test10 *)function_object;
  GVar1 = (*function_object->_vptr_functionObject[3])();
  if (GVar1 != 0) {
    argument = 0;
    do {
      if (argument == 0) {
        uVar4 = 0;
      }
      else {
        argument_00 = 0;
        uVar3 = 0;
        do {
          this_00 = (GPUShaderFP64Test10 *)function_object;
          GVar2 = functionObject::getArgumentStride(function_object,argument_00);
          uVar3 = uVar3 + GVar2;
          argument_00 = argument_00 + 1;
        } while (argument != argument_00);
        uVar4 = (ulong)uVar3;
      }
      prepareComponents(this_00,function_object,vertex,argument,buffer + uVar4);
      argument = argument + 1;
    } while (argument != GVar1);
  }
  return;
}

Assistant:

void GPUShaderFP64Test10::prepareArgument(const functionObject& function_object, glw::GLuint vertex,
										  glw::GLubyte* buffer)
{
	const glw::GLuint n_arguments = function_object.getArgumentCount();

	for (glw::GLuint argument = 0; argument < n_arguments; ++argument)
	{
		const glw::GLuint offset = function_object.getArgumentOffset(argument);

		prepareComponents(function_object, vertex, argument, buffer + offset);
	}
}